

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reliability_Header.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::Reliability_Header::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Reliability_Header *this)

{
  ostream *poVar1;
  KINT32 Value;
  KStringStream ss;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Required Reliability Service: ");
  DATA_TYPE::ENUMS::GetEnumAsStringRequiredReliabilityService_abi_cxx11_
            (&local_1c0,(ENUMS *)(ulong)this->m_ui8ReqRelSrv,Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Reliability_Header::GetAsString() const
{
    KStringStream ss;

    ss << "Required Reliability Service: " << GetEnumAsStringRequiredReliabilityService( m_ui8ReqRelSrv )
       << "\n";

    return ss.str();
}